

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

RtreeSearchPoint * rtreeEnqueue(RtreeCursor *pCur,RtreeDValue rScore,u8 iLevel)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  RtreeSearchPoint *pRVar4;
  uint uVar5;
  ulong nBytes;
  RtreeSearchPoint *pRVar6;
  uint i;
  
  iVar2 = pCur->nPointAlloc;
  uVar5 = pCur->nPoint;
  if ((int)uVar5 < iVar2) {
    pRVar4 = pCur->aPoint;
  }
  else {
    pRVar4 = pCur->aPoint;
    iVar3 = sqlite3_initialize();
    if (iVar3 != 0) {
      return (RtreeSearchPoint *)0x0;
    }
    iVar2 = iVar2 * 2 + 8;
    uVar5 = iVar2 * 0x18;
    nBytes = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      nBytes = 0;
    }
    pRVar4 = (RtreeSearchPoint *)sqlite3Realloc(pRVar4,nBytes);
    if (pRVar4 == (RtreeSearchPoint *)0x0) {
      return (RtreeSearchPoint *)0x0;
    }
    pCur->aPoint = pRVar4;
    pCur->nPointAlloc = iVar2;
    uVar5 = pCur->nPoint;
  }
  pCur->nPoint = uVar5 + 1;
  pRVar4 = pRVar4 + (int)uVar5;
  pRVar4->rScore = rScore;
  pRVar4->iLevel = iLevel;
  pRVar6 = pRVar4;
  if (0 < (int)uVar5) {
    do {
      uVar1 = uVar5 - 1;
      i = uVar1 >> 1;
      pRVar4 = pCur->aPoint + i;
      if (pRVar4->rScore <= pRVar6->rScore) {
        if (pRVar4->rScore < pRVar6->rScore) {
          return pRVar6;
        }
        if (pRVar4->iLevel <= pRVar6->iLevel) {
          return pRVar6;
        }
      }
      rtreeSearchPointSwap(pCur,i,uVar5);
      pRVar6 = pRVar4;
      uVar5 = i;
    } while (1 < uVar1);
  }
  return pRVar4;
}

Assistant:

static RtreeSearchPoint *rtreeEnqueue(
  RtreeCursor *pCur,    /* The cursor */
  RtreeDValue rScore,   /* Score for the new search point */
  u8 iLevel             /* Level for the new search point */
){
  int i, j;
  RtreeSearchPoint *pNew;
  if( pCur->nPoint>=pCur->nPointAlloc ){
    int nNew = pCur->nPointAlloc*2 + 8;
    pNew = sqlite3_realloc(pCur->aPoint, nNew*sizeof(pCur->aPoint[0]));
    if( pNew==0 ) return 0;
    pCur->aPoint = pNew;
    pCur->nPointAlloc = nNew;
  }
  i = pCur->nPoint++;
  pNew = pCur->aPoint + i;
  pNew->rScore = rScore;
  pNew->iLevel = iLevel;
  assert( iLevel<=RTREE_MAX_DEPTH );
  while( i>0 ){
    RtreeSearchPoint *pParent;
    j = (i-1)/2;
    pParent = pCur->aPoint + j;
    if( rtreeSearchPointCompare(pNew, pParent)>=0 ) break;
    rtreeSearchPointSwap(pCur, j, i);
    i = j;
    pNew = pParent;
  }
  return pNew;
}